

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.cpp
# Opt level: O2

BitmapDibHeader * Bitmap_Operation::getInfoHeader(uint32_t size)

{
  BitmapInfoHeader *this;
  
  if (size == 0x28) {
    this = (BitmapInfoHeader *)operator_new(0x38);
    BitmapInfoHeader::BitmapInfoHeader(this);
  }
  else if (size == 0xc) {
    this = (BitmapInfoHeader *)operator_new(0x18);
    (this->super_BitmapDibHeader)._vptr_BitmapDibHeader =
         (_func_int **)&PTR__BitmapDibHeader_001b37f0;
    this->biSize = 0xc;
    this->biWidth = 0;
    this->biHeight = 1;
    this->biPlanes = 0xc;
    this->biBitCount = 0;
  }
  else {
    this = (BitmapInfoHeader *)0x0;
  }
  return &this->super_BitmapDibHeader;
}

Assistant:

BitmapDibHeader * getInfoHeader( uint32_t size )
    {
        switch( size )
        {
            case 12u:
                return new BitmapCoreHeader;
            case 40u:
                return new BitmapInfoHeader;
            default:
                return nullptr;
        }
    }